

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

int doinvbill(int mode)

{
  nh_menuitem *pnVar1;
  int iVar2;
  monst *pmVar3;
  long lVar4;
  obj *poVar5;
  char *pcVar6;
  bill_x *pbVar7;
  bill_x *pbVar8;
  uint uVar9;
  long cost;
  long cost_00;
  bool bVar10;
  menulist menu;
  menulist local_50;
  monst *local_40;
  bill_x *local_38;
  
  pmVar3 = shop_keeper(level,u.ushops[0]);
  if ((pmVar3 == (monst *)0x0) || (iVar2 = inhishop(pmVar3), iVar2 == 0)) {
    if (mode != 0) {
      warning("doinvbill: no shopkeeper?");
      return 0;
    }
  }
  else {
    if (mode == 0) {
      bVar10 = *(int *)&pmVar3[0x1b].field_0x60 != 0;
      uVar9 = (uint)bVar10;
      lVar4 = (long)*(short *)((long)&pmVar3[0x1b].misc_worn_check + 2);
      if (lVar4 < 1) {
        return (uint)bVar10;
      }
      pbVar8 = *(bill_x **)&pmVar3[0x1b].mnum;
      pbVar7 = pbVar8 + lVar4;
      do {
        if ((pbVar8->useup != '\0') ||
           ((poVar5 = bp_to_obj(pbVar8), poVar5 != (obj *)0x0 && (poVar5->quan < pbVar8->bquan)))) {
          uVar9 = uVar9 + 1;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 < pbVar7);
      return uVar9;
    }
    init_menulist(&local_50);
    lVar4 = (long)local_50.size;
    if (local_50.size <= local_50.icount) {
      local_50.size = local_50.size * 2;
      local_50.items = (nh_menuitem *)realloc(local_50.items,lVar4 * 0x218);
    }
    lVar4 = (long)local_50.icount;
    local_50.items[lVar4].id = 0;
    local_50.items[lVar4].role = MI_TEXT;
    local_50.items[lVar4].accel = '\0';
    local_50.items[lVar4].group_accel = '\0';
    local_50.items[lVar4].selected = '\0';
    builtin_strncpy(local_50.items[lVar4].caption,"Unpaid articles ",0x10);
    builtin_strncpy(local_50.items[lVar4].caption + 0x10,"already used up:",0x10);
    local_50.items[lVar4].caption[0x20] = '\0';
    local_50.icount = local_50.icount + 1;
    lVar4 = (long)local_50.size;
    if (local_50.size <= local_50.icount) {
      local_50.size = local_50.size * 2;
      local_50.items = (nh_menuitem *)realloc(local_50.items,lVar4 * 0x218);
    }
    lVar4 = (long)local_50.icount;
    local_50.items[lVar4].accel = '\0';
    local_50.items[lVar4].group_accel = '\0';
    cost_00 = 0;
    local_50.items[lVar4].selected = '\0';
    local_50.items[lVar4].caption[0] = '\0';
    local_50.items[lVar4].id = 0;
    local_50.items[lVar4].role = MI_TEXT;
    local_50.icount = local_50.icount + 1;
    lVar4 = (long)*(short *)((long)&pmVar3[0x1b].misc_worn_check + 2);
    local_40 = pmVar3;
    if (0 < lVar4) {
      pbVar8 = *(bill_x **)&pmVar3[0x1b].mnum;
      pbVar7 = pbVar8 + lVar4;
      cost_00 = 0;
      local_38 = pbVar7;
      do {
        poVar5 = bp_to_obj(pbVar8);
        if (poVar5 == (obj *)0x0) {
          warning("Bad shopkeeper administration.");
          goto LAB_0023f059;
        }
        if ((pbVar8->useup != '\0') || (poVar5->quan < pbVar8->bquan)) {
          if (pbVar8->useup == '\0') {
            lVar4 = (long)pbVar8->bquan - (long)poVar5->quan;
          }
          else {
            lVar4 = (long)pbVar8->bquan;
          }
          uVar9 = *(uint *)&poVar5->field_0x4a;
          cost = pbVar8->price * lVar4;
          *(uint *)&poVar5->field_0x4a = uVar9 & 0xfffffffb;
          pcVar6 = xprname(poVar5,(char *)0x0,'x','\0',cost,lVar4);
          *(uint *)&poVar5->field_0x4a = *(uint *)&poVar5->field_0x4a & 0xfffffffb | uVar9 & 4;
          lVar4 = (long)local_50.size;
          if (local_50.size <= local_50.icount) {
            local_50.size = local_50.size * 2;
            local_50.items = (nh_menuitem *)realloc(local_50.items,lVar4 * 0x218);
          }
          cost_00 = cost_00 + cost;
          pnVar1 = local_50.items + local_50.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,pcVar6);
          local_50.icount = local_50.icount + 1;
          pbVar7 = local_38;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 < pbVar7);
    }
    pmVar3 = local_40;
    if (*(int *)&local_40[0x1b].field_0x60 != 0) {
      if (cost_00 != 0) {
        lVar4 = (long)local_50.size;
        if (local_50.size <= local_50.icount) {
          local_50.size = local_50.size * 2;
          local_50.items = (nh_menuitem *)realloc(local_50.items,lVar4 * 0x218);
        }
        lVar4 = (long)local_50.icount;
        local_50.items[lVar4].accel = '\0';
        local_50.items[lVar4].group_accel = '\0';
        local_50.items[lVar4].selected = '\0';
        local_50.items[lVar4].caption[0] = '\0';
        local_50.items[lVar4].id = 0;
        local_50.items[lVar4].role = MI_TEXT;
        local_50.icount = local_50.icount + 1;
      }
      iVar2 = *(int *)&pmVar3[0x1b].field_0x60;
      pcVar6 = xprname((obj *)0x0,"usage charges and/or other fees",'$','\0',(long)iVar2,0);
      lVar4 = (long)local_50.size;
      if (local_50.size <= local_50.icount) {
        local_50.size = local_50.size * 2;
        local_50.items = (nh_menuitem *)realloc(local_50.items,lVar4 * 0x218);
      }
      cost_00 = cost_00 + iVar2;
      pnVar1 = local_50.items + local_50.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,pcVar6);
      local_50.icount = local_50.icount + 1;
    }
    pcVar6 = xprname((obj *)0x0,"Total:",'*','\0',cost_00,0);
    lVar4 = (long)local_50.size;
    if (local_50.size <= local_50.icount) {
      local_50.size = local_50.size * 2;
      local_50.items = (nh_menuitem *)realloc(local_50.items,lVar4 * 0x218);
    }
    lVar4 = (long)local_50.icount;
    local_50.items[lVar4].accel = '\0';
    local_50.items[lVar4].group_accel = '\0';
    local_50.items[lVar4].selected = '\0';
    local_50.items[lVar4].caption[0] = '\0';
    local_50.items[lVar4].id = 0;
    local_50.items[lVar4].role = MI_TEXT;
    local_50.icount = local_50.icount + 1;
    lVar4 = (long)local_50.size;
    if (local_50.size <= local_50.icount) {
      local_50.size = local_50.size * 2;
      local_50.items = (nh_menuitem *)realloc(local_50.items,lVar4 * 0x218);
    }
    pnVar1 = local_50.items + local_50.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,pcVar6);
    local_50.icount = local_50.icount + 1;
    display_menu(local_50.items,local_50.icount,(char *)0x0,0,(int *)0x0);
LAB_0023f059:
    free(local_50.items);
  }
  return 0;
}

Assistant:

int doinvbill(int mode)
{
	struct monst *shkp;
	struct eshk *eshkp;
	struct bill_x *bp, *end_bp;
	struct obj *obj;
	long totused;
	char *buf_p;
	struct menulist menu;

	shkp = shop_keeper(level, *u.ushops);
	if (!shkp || !inhishop(shkp)) {
	    if (mode != 0) warning("doinvbill: no shopkeeper?");
	    return 0;
	}
	eshkp = ESHK(shkp);

	if (mode == 0) {
	    /* count expended items, so that the `I' command can decide
	       whether to include 'x' in its prompt string */
	    int cnt = !eshkp->debit ? 0 : 1;

	    for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		    bp < end_bp; bp++)
		if (bp->useup ||
			((obj = bp_to_obj(bp)) != 0 && obj->quan < bp->bquan))
		    cnt++;
	    return cnt;
	}

	init_menulist(&menu);
	add_menutext(&menu, "Unpaid articles already used up:");
	add_menutext(&menu, "");

	totused = 0L;
	for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		bp < end_bp; bp++) {
	    obj = bp_to_obj(bp);
	    if (!obj) {
		warning("Bad shopkeeper administration.");
		goto quit;
	    }
	    if (bp->useup || bp->bquan > obj->quan) {
		long oquan, uquan, thisused;
		unsigned save_unpaid;

		save_unpaid = obj->unpaid;
		oquan = obj->quan;
		uquan = (bp->useup ? bp->bquan : bp->bquan - oquan);
		thisused = bp->price * uquan;
		totused += thisused;
		obj->unpaid = 0;		/* ditto */
		/* Why 'x'?  To match `I x', more or less. */
		buf_p = xprname(obj, NULL, 'x', FALSE, thisused, uquan);
		obj->unpaid = save_unpaid;
		add_menutext(&menu, buf_p);
	    }
	}
	if (eshkp->debit) {
	    /* additional shop debt which has no itemization available */
	    if (totused) add_menutext(&menu, "");
	    totused += eshkp->debit;
	    buf_p = xprname(NULL,
			    "usage charges and/or other fees",
			    GOLD_SYM, FALSE, eshkp->debit, 0L);
	    add_menutext(&menu, buf_p);
	}
	buf_p = xprname(NULL, "Total:", '*', FALSE, totused, 0L);
	add_menutext(&menu, "");
	add_menutext(&menu, buf_p);
	
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    quit:
	free(menu.items);
	return 0;
}